

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_manager.cpp
# Opt level: O3

bool spvtools::opt::operator==(FeatureManager *a,FeatureManager *b)

{
  bool bVar1;
  
  if (a->grammar_ != b->grammar_) {
    return false;
  }
  bVar1 = spvtools::operator==(&a->capabilities_,&b->capabilities_);
  if ((((bVar1) && (bVar1 = spvtools::operator==(&a->extensions_,&b->extensions_), bVar1)) &&
      (a->extinst_importid_GLSLstd450_ == b->extinst_importid_GLSLstd450_)) &&
     (a->extinst_importid_OpenCL100DebugInfo_ == b->extinst_importid_OpenCL100DebugInfo_)) {
    return a->extinst_importid_Shader100DebugInfo_ == b->extinst_importid_Shader100DebugInfo_;
  }
  return false;
}

Assistant:

bool operator==(const FeatureManager& a, const FeatureManager& b) {
  // We check that the addresses of the grammars are the same because they
  // are large objects, and this is faster.  It can be changed if needed as a
  // later time.
  if (&a.grammar_ != &b.grammar_) {
    return false;
  }

  if (a.capabilities_ != b.capabilities_) {
    return false;
  }

  if (a.extensions_ != b.extensions_) {
    return false;
  }

  if (a.extinst_importid_GLSLstd450_ != b.extinst_importid_GLSLstd450_) {
    return false;
  }

  if (a.extinst_importid_OpenCL100DebugInfo_ !=
      b.extinst_importid_OpenCL100DebugInfo_) {
    return false;
  }

  if (a.extinst_importid_Shader100DebugInfo_ !=
      b.extinst_importid_Shader100DebugInfo_) {
    return false;
  }

  return true;
}